

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O2

void thread_switch(Thread *from,Thread *to)

{
  Sched *pSVar1;
  char *pcVar2;
  
  pSVar1 = from->sched;
  if (pSVar1->running == from) {
    if (the_thread == from) {
      if (pSVar1->fuel != 0) {
        pSVar1->fuel = pSVar1->fuel - 1;
      }
      pSVar1->running = to;
      the_thread = to;
      fiber_switch(&from->fiber,&to->fiber);
      return;
    }
    pcVar2 = "the_thread == from";
  }
  else {
    pcVar2 = "sched->running == from";
  }
  fprintf(_stderr,"requirement not met: %s\n",pcVar2);
  abort();
}

Assistant:

static void
thread_switch(Thread *from, Thread *to)
{
    Sched *sched = from->sched;
    require(sched->running == from);
    require(the_thread == from);

    if (sched->fuel > 0)
        --sched->fuel;

    sched->running = to;
    the_thread = to;
    fiber_switch(thread_fiber(from), thread_fiber(to));
}